

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O1

string * __thiscall
flatbuffers::rust::RustGenerator::WrapInNameSpace
          (string *__return_storage_ptr__,RustGenerator *this,Namespace *ns,string *name)

{
  pointer pcVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  string prefix;
  string local_48;
  
  iVar2 = (*(this->super_BaseGenerator)._vptr_BaseGenerator[3])(this);
  if ((Namespace *)CONCAT44(extraout_var,iVar2) == ns) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (name->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + name->_M_string_length);
  }
  else {
    iVar2 = (*(this->super_BaseGenerator)._vptr_BaseGenerator[3])(this);
    GetRelativeNamespaceTraversal_abi_cxx11_
              (&local_48,this,(Namespace *)CONCAT44(extraout_var_00,iVar2),ns);
    std::operator+(__return_storage_ptr__,&local_48,name);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string WrapInNameSpace(const Namespace *ns,
                              const std::string &name) const {
    if (CurrentNameSpace() == ns) return name;
    std::string prefix = GetRelativeNamespaceTraversal(CurrentNameSpace(), ns);
    return prefix + name;
  }